

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::fromFileInMemory
          (string_view text,SourceManager *sourceManager,string_view name,string_view path,
          Bag *options)

{
  string_view text_00;
  string_view path_00;
  string_view name_00;
  bool bVar1;
  SourceBuffer *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> sVar3;
  SourceManager *in_stack_00000078;
  SourceLocation in_stack_00000080;
  undefined7 in_stack_00000088;
  uint8_t in_stack_0000008f;
  char *in_stack_00000090;
  SourceManager *in_stack_00000098;
  char *in_stack_000000a0;
  char *in_stack_000000a8;
  SourceLocation in_stack_000000b0;
  SourceBuffer buffer;
  undefined1 in_stack_0000090f;
  Bag *in_stack_00000910;
  SourceManager *in_stack_00000918;
  span<const_slang::SourceBuffer,_18446744073709551615UL> in_stack_00000920;
  MacroList in_stack_00000940;
  shared_ptr<slang::syntax::SyntaxTree> *this;
  SourceLocation *in_stack_ffffffffffffff08;
  span<const_slang::SourceBuffer,_18446744073709551615UL> *in_stack_ffffffffffffff10;
  SourceLocation local_78 [9];
  SourceBuffer *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_30 = in_RCX;
  SourceLocation::SourceLocation(local_78);
  this = (shared_ptr<slang::syntax::SyntaxTree> *)0x0;
  path_00._M_str = in_stack_000000a0;
  path_00._M_len = (size_t)in_stack_00000098;
  text_00._M_len._7_1_ = in_stack_0000008f;
  text_00._M_len._0_7_ = in_stack_00000088;
  text_00._M_str = in_stack_00000090;
  SourceManager::assignText
            (in_stack_00000078,path_00,text_00,in_stack_00000080,(SourceLibrary *)buffer.data._M_len
            );
  bVar1 = SourceBuffer::operator_cast_to_bool((SourceBuffer *)0x67b20c);
  if (bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
    if (!bVar1) {
      SourceLocation::SourceLocation
                (in_stack_ffffffffffffff08,
                 (BufferID)(uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),(uint64_t)this);
      name_00._M_str = in_stack_000000a8;
      name_00._M_len = (size_t)in_stack_000000a0;
      SourceManager::addLineDirective
                (in_stack_00000098,in_stack_000000b0,(size_t)in_stack_00000090,name_00,
                 in_stack_0000008f);
    }
    std::span<slang::SourceBuffer,_18446744073709551615UL>::span<slang::SourceBuffer_*>
              ((span<slang::SourceBuffer,_18446744073709551615UL> *)in_stack_ffffffffffffff10,
               local_30,(size_type)this);
    std::span<const_slang::SourceBuffer,_18446744073709551615UL>::
    span<slang::SourceBuffer,_18446744073709551615UL>
              (in_stack_ffffffffffffff10,
               (span<slang::SourceBuffer,_18446744073709551615UL> *)local_30);
    std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
              ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
               0x67b2ef);
    sVar3 = create(in_stack_00000918,in_stack_00000920,in_stack_00000910,in_stack_00000940,
                   (bool)in_stack_0000090f);
    _Var2 = sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr(this,(nullptr_t)local_78[0]);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromFileInMemory(std::string_view text,
                                                         SourceManager& sourceManager,
                                                         std::string_view name,
                                                         std::string_view path,
                                                         const Bag& options) {
    SourceBuffer buffer = sourceManager.assignText(path, text);
    if (!buffer)
        return nullptr;

    if (!name.empty())
        sourceManager.addLineDirective(SourceLocation(buffer.id, 0), 2, name, 0);

    return create(sourceManager, std::span(&buffer, 1), options, {}, false);
}